

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O3

cgltf_float
cgltf_component_read_float(void *in,cgltf_component_type component_type,cgltf_bool normalized)

{
  ulong uVar1;
  
  if (component_type == cgltf_component_type_r_32f) {
    return *in;
  }
  if (normalized == 0) {
    switch(component_type - cgltf_component_type_r_8) {
    case cgltf_component_type_invalid:
      uVar1 = (ulong)*in;
      break;
    case cgltf_component_type_r_8:
      uVar1 = (ulong)*in;
      break;
    case cgltf_component_type_r_8u:
      uVar1 = (ulong)*in;
      break;
    case cgltf_component_type_r_16:
      uVar1 = (ulong)*in;
      break;
    case cgltf_component_type_r_16u:
      uVar1 = (ulong)*in;
      break;
    default:
      uVar1 = 0;
    }
    if ((long)uVar1 < 0) {
      return (float)uVar1;
    }
    return (float)(long)uVar1;
  }
  switch(component_type - cgltf_component_type_r_8) {
  case cgltf_component_type_invalid:
    return (float)(int)*in / 127.0;
  case cgltf_component_type_r_8:
    return (float)*in / 255.0;
  case cgltf_component_type_r_8u:
    return (float)(int)*in / 32767.0;
  case cgltf_component_type_r_16:
    return (float)*in / 65535.0;
  default:
    return 0.0;
  }
}

Assistant:

static cgltf_float cgltf_component_read_float(const void* in, cgltf_component_type component_type, cgltf_bool normalized)
{
    if (component_type == cgltf_component_type_r_32f)
    {
        return *((const float*) in);
    }

    if (normalized)
    {
        switch (component_type)
        {
            // note: glTF spec doesn't currently define normalized conversions for 32-bit integers
            case cgltf_component_type_r_16:
                return *((const int16_t*) in) / (cgltf_float)32767;
            case cgltf_component_type_r_16u:
                return *((const uint16_t*) in) / (cgltf_float)65535;
            case cgltf_component_type_r_8:
                return *((const int8_t*) in) / (cgltf_float)127;
            case cgltf_component_type_r_8u:
                return *((const uint8_t*) in) / (cgltf_float)255;
            default:
                return 0;
        }
    }

    return (cgltf_float)cgltf_component_read_index(in, component_type);
}